

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  element_type *this;
  ostream *poVar2;
  element_type *this_00;
  int local_224;
  duration<long,_std::ratio<1L,_1000L>_> local_220;
  string local_218 [32];
  undefined1 local_1f8 [16];
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  ostringstream local_1d8 [8];
  ostringstream buf;
  int local_5c;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  shared_ptr<Common::Listener> local_50 [2];
  undefined1 local_30 [8];
  shared_ptr<SimpleZomby::Zomby> simpleZomby;
  shared_ptr<Common::WriteToConsoleListener> writeToConsoleListener;
  
  Common::WriteToConsoleListener::instance();
  SimpleZomby::Zomby::create();
  this = std::__shared_ptr_access<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_30);
  std::shared_ptr<Common::Listener>::shared_ptr<Common::WriteToConsoleListener,void>
            (local_50,(shared_ptr<Common::WriteToConsoleListener> *)
                      &simpleZomby.
                       super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  SimpleZomby::Zomby::runOnce(this,local_50);
  std::shared_ptr<Common::Listener>::~shared_ptr(local_50);
  local_5c = 0x1194;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_58,&local_5c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
  std::shared_ptr<SimpleZomby::Zomby>::~shared_ptr((shared_ptr<SimpleZomby::Zomby> *)local_30);
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar2 = std::operator<<((ostream *)local_1d8,
                           "============================================================\n");
  poVar2 = std::operator<<(poVar2,"|                      Zomby was killed                    |\n");
  std::operator<<(poVar2,"============================================================\n");
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &simpleZomby.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&simpleZomby.
                               super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    std::__cxx11::ostringstream::str();
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
    std::shared_ptr<std::__cxx11::string_const>::shared_ptr<std::__cxx11::string,void>
              ((shared_ptr<std::__cxx11::string_const> *)&local_1e8,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1f8);
    Common::WriteToConsoleListener::processData(this_00,&local_1e8);
    std::
    shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~shared_ptr(&local_1e8);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1f8);
    std::__cxx11::string::~string(local_218);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  local_224 = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_220,&local_224);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_220);
  std::shared_ptr<Common::WriteToConsoleListener>::~shared_ptr
            ((shared_ptr<Common::WriteToConsoleListener> *)
             &simpleZomby.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0;
}

Assistant:

int main()
{
    auto writeToConsoleListener = Common::WriteToConsoleListener::instance();

    {
        auto simpleZomby = SimpleZomby::Zomby::create();
        simpleZomby->runOnce(writeToConsoleListener);

        std::this_thread::sleep_for(std::chrono::milliseconds(4500));
    } // Zomby should be killed here

    {
        std::ostringstream buf;
        buf << "============================================================\n"
            << "|                      Zomby was killed                    |\n"
            << "============================================================\n";
        if (writeToConsoleListener) {
            writeToConsoleListener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
        }
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(5000));

    return 0;
}